

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::AddCXXCompileCommand
          (cmGlobalNinjaGenerator *this,string *commandLine,string *sourceFile,string *objPath)

{
  cmGeneratedFileStream *pcVar1;
  size_t sVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  string sourceFileName;
  string buildFilePath;
  string buildFileDir;
  cmAlphaNum local_100;
  string local_d0;
  cmAlphaNum local_b0;
  string local_80;
  string local_60;
  string local_40;
  
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  std::__cxx11::string::string((string *)&local_80,(string *)psVar4);
  pcVar1 = (this->CompileCommandsStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar1 == (cmGeneratedFileStream *)0x0) {
    local_100.View_._M_len = local_80._M_string_length;
    local_100.View_._M_str = local_80._M_dataplus._M_p;
    local_b0.View_._M_len = 0x16;
    local_b0.View_._M_str = "/compile_commands.json";
    cmStrCat<>(&local_d0,&local_100,&local_b0);
    if (this->ComputingUnknownDependencies == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"compile_commands.json",(allocator<char> *)&local_60);
      NinjaOutputPath((string *)&local_100,this,(string *)&local_b0);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->CombinedBuildOutputs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100);
    sVar2 = local_100.View_._M_len;
    local_100.View_._M_len = 0;
    pcVar1 = (this->CompileCommandsStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    (this->CompileCommandsStream)._M_t.
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
         (cmGeneratedFileStream *)sVar2;
    if (pcVar1 != (cmGeneratedFileStream *)0x0) {
      (**(code **)(*(long *)&(pcVar1->super_ofstream).
                             super_basic_ostream<char,_std::char_traits<char>_> + 8))();
      if ((long *)local_100.View_._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_100.View_._M_len + 8))();
      }
    }
    std::operator<<((ostream *)
                    (this->CompileCommandsStream)._M_t.
                    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                    .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"[\n");
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    std::operator<<((ostream *)pcVar1,",\n");
  }
  std::__cxx11::string::string((string *)&local_100,(string *)sourceFile);
  bVar3 = cmsys::SystemTools::FileIsFullPath((string *)&local_100);
  if (!bVar3) {
    psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    cmsys::SystemTools::CollapseFullPath((string *)&local_b0,(string *)&local_100,psVar4);
    std::__cxx11::string::operator=((string *)&local_100,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  poVar5 = std::operator<<((ostream *)
                           (this->CompileCommandsStream)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"{\n"
                          );
  poVar5 = std::operator<<(poVar5,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON((string *)&local_b0,&local_80);
  poVar5 = std::operator<<(poVar5,(string *)&local_b0);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_d0,commandLine);
  poVar5 = std::operator<<(poVar5,(string *)&local_d0);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_60,(string *)&local_100);
  poVar5 = std::operator<<(poVar5,(string *)&local_60);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"output\": \"");
  cmGlobalGenerator::EscapeJSON(&local_40,objPath);
  poVar5 = std::operator<<(poVar5,(string *)&local_40);
  poVar5 = std::operator<<(poVar5,"\"\n");
  std::operator<<(poVar5,"}");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCXXCompileCommand(
  const std::string& commandLine, const std::string& sourceFile,
  const std::string& objPath)
{
  // Compute Ninja's build file path.
  std::string buildFileDir =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  if (!this->CompileCommandsStream) {
    std::string buildFilePath =
      cmStrCat(buildFileDir, "/compile_commands.json");
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(
        this->NinjaOutputPath("compile_commands.json"));
    }

    // Get a stream where to generate things.
    this->CompileCommandsStream =
      cm::make_unique<cmGeneratedFileStream>(buildFilePath);
    *this->CompileCommandsStream << "[\n";
  } else {
    *this->CompileCommandsStream << ",\n";
  }

  std::string sourceFileName = sourceFile;
  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    sourceFileName = cmSystemTools::CollapseFullPath(
      sourceFileName, this->GetCMakeInstance()->GetHomeOutputDirectory());
  }

  /* clang-format off */
  *this->CompileCommandsStream << "{\n"
     << R"(  "directory": ")"
     << cmGlobalGenerator::EscapeJSON(buildFileDir) << "\",\n"
     << R"(  "command": ")"
     << cmGlobalGenerator::EscapeJSON(commandLine) << "\",\n"
     << R"(  "file": ")"
     << cmGlobalGenerator::EscapeJSON(sourceFileName) << "\",\n"
     << R"(  "output": ")"
     << cmGlobalGenerator::EscapeJSON(objPath) << "\"\n"
     << "}";
  /* clang-format on */
}